

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_ssse3.h
# Opt level: O1

void shuffle_filter_ssse3(int16_t *filter,__m128i *f)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  
  auVar1 = *(undefined1 (*) [16])filter;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_00517cd0);
  *f = alVar2;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_00517d20);
  f[1] = alVar2;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_00517cf0);
  f[2] = alVar2;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_00517d30);
  f[3] = alVar2;
  return;
}

Assistant:

static inline void shuffle_filter_ssse3(const int16_t *const filter,
                                        __m128i *const f) {
  const __m128i f_values = _mm_load_si128((const __m128i *)filter);
  // pack and duplicate the filter values
  f[0] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0200u));
  f[1] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0604u));
  f[2] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0a08u));
  f[3] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0e0cu));
}